

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snestistics.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int *this;
  bool bVar1;
  undefined8 uVar2;
  size_type_conflict sVar3;
  reference pvVar4;
  ulong uVar5;
  char *pcVar6;
  FILE *__stream;
  ReportWriter *this_00;
  pointer writer;
  type pRVar7;
  Trace **local_4c0;
  runtime_error *e;
  exception *e_1;
  ReportWriter asm_output;
  Profile profile_5;
  unique_ptr<ReportWriter,_std::default_delete<ReportWriter>_> report_writer;
  Scripting *scripting;
  undefined1 local_458 [7];
  bool has_scripting;
  Profile profile_4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  copy;
  Profile profile_3;
  AnnotationResolver annotations;
  AnnotationResolver annotations_1;
  Profile profile_2;
  bool auto_file_exists;
  FILE *test_file;
  Profile profile_1;
  Trace *local_trace;
  Trace backing_trace;
  undefined1 local_288 [3];
  bool generate;
  uint32_t k;
  Trace trace;
  Profile profile;
  RomAccessor rom_accessor;
  Options options;
  char **argv_local;
  int argc_local;
  
  snestistics::initLookupTables();
  this = &rom_accessor._rom_data._size;
  Options::Options((Options *)this);
  parse_options(argc,argv,(Options *)this);
  uVar2 = std::__cxx11::string::c_str();
  printf("Loading ROM \'%s\'\n",uVar2);
  snestistics::RomAccessor::RomAccessor((RomAccessor *)&profile._hide_if_fast,options._24_4_);
  snestistics::Profile::Profile((Profile *)&trace.is_predicted._num_elements,"Load ROM data",false);
  snestistics::RomAccessor::load
            ((RomAccessor *)&profile._hide_if_fast,(string *)&rom_accessor._rom_data._size);
  snestistics::Profile::~Profile((Profile *)&trace.is_predicted._num_elements);
  snestistics::Trace::Trace((Trace *)local_288);
  for (backing_trace.is_predicted._12_4_ = 0; uVar5 = (ulong)(uint)backing_trace.is_predicted._12_4_
      , sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&options.rom_size), uVar5 < sVar3;
      backing_trace.is_predicted._12_4_ = backing_trace.is_predicted._12_4_ + 1) {
    backing_trace.is_predicted._num_elements._3_1_ = 1;
    snestistics::Trace::Trace((Trace *)&local_trace);
    if (backing_trace.is_predicted._12_4_ == 0) {
      local_4c0 = (Trace **)local_288;
    }
    else {
      local_4c0 = &local_trace;
    }
    profile_1._16_8_ = local_4c0;
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&options.rom_size,(ulong)(uint)backing_trace.is_predicted._12_4_);
    bVar1 = snestistics::load_trace_cache(pvVar4,(Trace *)profile_1._16_8_);
    if (bVar1) {
      backing_trace.is_predicted._num_elements._3_1_ = 0;
    }
    if ((backing_trace.is_predicted._num_elements._3_1_ & 1) != 0) {
      snestistics::Profile::Profile((Profile *)&test_file,"Create trace using emulation",false);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&options.rom_size,(ulong)(uint)backing_trace.is_predicted._12_4_);
      snestistics::create_trace
                (pvVar4,(RomAccessor *)&profile._hide_if_fast,(Trace *)profile_1._16_8_);
      snestistics::Profile::~Profile((Profile *)&test_file);
    }
    if (backing_trace.is_predicted._12_4_ != 0) {
      snestistics::merge_trace((Trace *)local_288,(Trace *)profile_1._16_8_);
    }
    snestistics::Trace::~Trace((Trace *)&local_trace);
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    pcVar6 = (char *)std::__cxx11::string::c_str();
    __stream = fopen(pcVar6,"rb");
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
    }
    if (((options._184_1_ & 1) != 0) || (__stream == (FILE *)0x0)) {
      snestistics::Profile::Profile
                ((Profile *)&annotations_1._hint_for_adress._size,"Regenerating auto-labels",false);
      snestistics::AnnotationResolver::AnnotationResolver
                ((AnnotationResolver *)&annotations._hint_for_adress._size);
      snestistics::AnnotationResolver::load
                ((AnnotationResolver *)&annotations._hint_for_adress._size,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&options.field_0x80);
      snestistics::guess_range
                ((Trace *)local_288,(RomAccessor *)&profile._hide_if_fast,
                 (AnnotationResolver *)&annotations._hint_for_adress._size,
                 (string *)
                 &options.labels_files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      snestistics::AnnotationResolver::~AnnotationResolver
                ((AnnotationResolver *)&annotations._hint_for_adress._size);
      snestistics::Profile::~Profile((Profile *)&annotations_1._hint_for_adress._size);
    }
  }
  snestistics::AnnotationResolver::AnnotationResolver
            ((AnnotationResolver *)&profile_3._hide_if_fast);
  snestistics::Profile::Profile
            ((Profile *)
             &copy.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"Loading game annotations",false);
  snestistics::AnnotationResolver::add_mmio_annotations
            ((AnnotationResolver *)&profile_3._hide_if_fast);
  snestistics::AnnotationResolver::add_vector_annotations
            ((AnnotationResolver *)&profile_3._hide_if_fast,(RomAccessor *)&profile._hide_if_fast);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&profile_4._hide_if_fast,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&options.field_0x80);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&profile_4._hide_if_fast,
                (value_type *)
                &options.labels_files.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    snestistics::AnnotationResolver::load
              ((AnnotationResolver *)&profile_3._hide_if_fast,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&profile_4._hide_if_fast);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&profile_4._hide_if_fast);
  }
  else {
    snestistics::AnnotationResolver::load
              ((AnnotationResolver *)&profile_3._hide_if_fast,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&options.field_0x80);
  }
  snestistics::Profile::~Profile
            ((Profile *)
             &copy.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    snestistics::symbol_export_fma
              ((AnnotationResolver *)&profile_3._hide_if_fast,(string *)&options.auto_annotate,false
              );
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    snestistics::symbol_export_mesen_s
              ((AnnotationResolver *)&profile_3._hide_if_fast,(string *)&options.field_0xe0);
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    snestistics::rewind_report
              ((Options *)&rom_accessor._rom_data._size,(RomAccessor *)&profile._hide_if_fast,
               (AnnotationResolver *)&profile_3._hide_if_fast);
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    snestistics::Profile::Profile((Profile *)local_458,"Create trace log",false);
    std::__cxx11::string::empty();
    report_writer._M_t.super___uniq_ptr_impl<ReportWriter,_std::default_delete<ReportWriter>_>._M_t.
    super__Tuple_impl<0UL,_ReportWriter_*,_std::default_delete<ReportWriter>_>.
    super__Head_base<0UL,_ReportWriter_*,_false>._M_head_impl =
         (__uniq_ptr_data<ReportWriter,_std::default_delete<ReportWriter>,_true,_true>)
         (__uniq_ptr_impl<ReportWriter,_std::default_delete<ReportWriter>_>)0x0;
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      pcVar6 = (char *)std::__cxx11::string::c_str();
      report_writer._M_t.super___uniq_ptr_impl<ReportWriter,_std::default_delete<ReportWriter>_>.
      _M_t.super__Tuple_impl<0UL,_ReportWriter_*,_std::default_delete<ReportWriter>_>.
      super__Head_base<0UL,_ReportWriter_*,_false>._M_head_impl =
           (__uniq_ptr_data<ReportWriter,_std::default_delete<ReportWriter>,_true,_true>)
           scripting_interface::create_scripting(pcVar6);
    }
    snestistics::write_trace_log
              ((Options *)&rom_accessor._rom_data._size,(RomAccessor *)&profile._hide_if_fast,
               (AnnotationResolver *)&profile_3._hide_if_fast,
               (Scripting *)
               report_writer._M_t.
               super___uniq_ptr_impl<ReportWriter,_std::default_delete<ReportWriter>_>._M_t.
               super__Tuple_impl<0UL,_ReportWriter_*,_std::default_delete<ReportWriter>_>.
               super__Head_base<0UL,_ReportWriter_*,_false>._M_head_impl);
    if ((__uniq_ptr_impl<ReportWriter,_std::default_delete<ReportWriter>_>)
        report_writer._M_t.super___uniq_ptr_impl<ReportWriter,_std::default_delete<ReportWriter>_>.
        _M_t.super__Tuple_impl<0UL,_ReportWriter_*,_std::default_delete<ReportWriter>_>.
        super__Head_base<0UL,_ReportWriter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<ReportWriter,_std::default_delete<ReportWriter>_>)0x0) {
      scripting_interface::destroy_scripting
                ((Scripting *)
                 report_writer._M_t.
                 super___uniq_ptr_impl<ReportWriter,_std::default_delete<ReportWriter>_>._M_t.
                 super__Tuple_impl<0UL,_ReportWriter_*,_std::default_delete<ReportWriter>_>.
                 super__Head_base<0UL,_ReportWriter_*,_false>._M_head_impl);
    }
    snestistics::Profile::~Profile((Profile *)local_458);
  }
  std::unique_ptr<ReportWriter,std::default_delete<ReportWriter>>::
  unique_ptr<std::default_delete<ReportWriter>,void>
            ((unique_ptr<ReportWriter,std::default_delete<ReportWriter>> *)&profile_5._hide_if_fast)
  ;
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    this_00 = (ReportWriter *)operator_new(0x10);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    ReportWriter::ReportWriter(this_00,pcVar6);
    std::unique_ptr<ReportWriter,_std::default_delete<ReportWriter>_>::reset
              ((unique_ptr<ReportWriter,_std::default_delete<ReportWriter>_> *)
               &profile_5._hide_if_fast,this_00);
  }
  writer = std::unique_ptr<ReportWriter,_std::default_delete<ReportWriter>_>::get
                     ((unique_ptr<ReportWriter,_std::default_delete<ReportWriter>_> *)
                      &profile_5._hide_if_fast);
  snestistics::predict
            (options._392_4_,writer,(RomAccessor *)&profile._hide_if_fast,(Trace *)local_288,
             (AnnotationResolver *)&profile_3._hide_if_fast);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    snestistics::Profile::Profile((Profile *)&asm_output.indentation,"Writing asm",false);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    ReportWriter::ReportWriter((ReportWriter *)&e_1,pcVar6);
    snestistics::asm_writer
              ((ReportWriter *)&e_1,(Options *)&rom_accessor._rom_data._size,(Trace *)local_288,
               (AnnotationResolver *)&profile_3._hide_if_fast,(RomAccessor *)&profile._hide_if_fast)
    ;
    ReportWriter::~ReportWriter((ReportWriter *)&e_1);
    snestistics::Profile::~Profile((Profile *)&asm_output.indentation);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&profile_5._hide_if_fast);
  if (bVar1) {
    pRVar7 = std::unique_ptr<ReportWriter,_std::default_delete<ReportWriter>_>::operator*
                       ((unique_ptr<ReportWriter,_std::default_delete<ReportWriter>_> *)
                        &profile_5._hide_if_fast);
    data_report(pRVar7,(Trace *)local_288,(AnnotationResolver *)&profile_3._hide_if_fast,true,true);
    pRVar7 = std::unique_ptr<ReportWriter,_std::default_delete<ReportWriter>_>::operator*
                       ((unique_ptr<ReportWriter,_std::default_delete<ReportWriter>_> *)
                        &profile_5._hide_if_fast);
    dma_report(pRVar7,(Trace *)local_288,(AnnotationResolver *)&profile_3._hide_if_fast);
    pRVar7 = std::unique_ptr<ReportWriter,_std::default_delete<ReportWriter>_>::operator*
                       ((unique_ptr<ReportWriter,_std::default_delete<ReportWriter>_> *)
                        &profile_5._hide_if_fast);
    branch_report(pRVar7,(RomAccessor *)&profile._hide_if_fast,(Trace *)local_288,
                  (AnnotationResolver *)&profile_3._hide_if_fast);
    pRVar7 = std::unique_ptr<ReportWriter,_std::default_delete<ReportWriter>_>::operator*
                       ((unique_ptr<ReportWriter,_std::default_delete<ReportWriter>_> *)
                        &profile_5._hide_if_fast);
    entry_point_report(pRVar7,(Trace *)local_288,(AnnotationResolver *)&profile_3._hide_if_fast);
  }
  std::unique_ptr<ReportWriter,_std::default_delete<ReportWriter>_>::~unique_ptr
            ((unique_ptr<ReportWriter,_std::default_delete<ReportWriter>_> *)
             &profile_5._hide_if_fast);
  snestistics::AnnotationResolver::~AnnotationResolver
            ((AnnotationResolver *)&profile_3._hide_if_fast);
  snestistics::Trace::~Trace((Trace *)local_288);
  snestistics::RomAccessor::~RomAccessor((RomAccessor *)&profile._hide_if_fast);
  Options::~Options((Options *)&rom_accessor._rom_data._size);
  return 0;
}

Assistant:

int main(const int argc, const char * const argv[]) {
	try {
		initLookupTables();

		Options options;
		parse_options(argc, argv, options);

		printf("Loading ROM '%s'\n", options.rom_file.c_str());

		// TODO: TraceHeader has rom_size and rom_mode (lorom/hirom) so lets read them!
		RomAccessor rom_accessor(options.rom_size);
		{
			Profile profile("Load ROM data");
			rom_accessor.load(options.rom_file);
		}

		Trace trace;

		for (uint32_t k=0; k<options.trace_files.size(); ++k) {
			bool generate = true;

			Trace backing_trace;
			Trace &local_trace = k==0 ? trace : backing_trace;

			if (load_trace_cache(options.trace_files[k], local_trace))
				generate = false;

			if (generate) {
				Profile profile("Create trace using emulation");
				create_trace(options.trace_files[k], rom_accessor, local_trace); // Will automatically save new cache
			}

			if (k != 0) {
				merge_trace(trace, local_trace);
			}
		}

		if (!options.auto_labels_file.empty()) {
			FILE *test_file = fopen(options.auto_labels_file.c_str(), "rb");
			bool auto_file_exists = test_file != NULL;
			if (test_file != NULL) {
				fclose(test_file);
			}
			
			if (options.auto_annotate || !auto_file_exists) {
				Profile profile("Regenerating auto-labels");
				// We load annotations here since we want to avoid the annotation file
				AnnotationResolver annotations;
				annotations.load(options.labels_files);
				guess_range(trace, rom_accessor, annotations, options.auto_labels_file);
			}
		}

		AnnotationResolver annotations;
		{
			Profile profile("Loading game annotations");
			annotations.add_mmio_annotations();
			annotations.add_vector_annotations(rom_accessor);
			if (options.auto_labels_file.empty()) {
				// Don't load the auto-labels file if we are re-generating it
				annotations.load(options.labels_files);
			} else {
				std::vector<std::string> copy(options.labels_files);
				copy.push_back(options.auto_labels_file);
				annotations.load(copy);
			}
		}

		if (!options.symbol_fma_out_file.empty()) {
			symbol_export_fma(annotations, options.symbol_fma_out_file, false);
		}

		if (!options.symbol_mesen_s_out_file.empty()) {
			// false here is to disable multiline comments since bsnes-plus does not support them
			symbol_export_mesen_s(annotations, options.symbol_mesen_s_out_file);
		}

		// Make sure this happens after create_trace so skip file is fresh
		if (!options.rewind_out_file.empty()) {
			rewind_report(options, rom_accessor, annotations);
		}

		// Write trace log if requested
		if (!options.trace_log_out_file.empty()) {
			Profile profile("Create trace log");

			bool has_scripting = !options.script_file.empty();

			scripting_interface::Scripting *scripting = nullptr;
			
			if (!options.script_file.empty())
				scripting = scripting_interface::create_scripting(options.script_file.c_str());
			
			write_trace_log(options, rom_accessor, annotations, scripting);

			if (scripting)
				scripting_interface::destroy_scripting(scripting);
		}

		std::unique_ptr<ReportWriter> report_writer;
		if (!options.report_out_file.empty())
			report_writer.reset(new ReportWriter(options.report_out_file.c_str()));

		// TODO: Maybe run once before guess_range as well to find longer ranges
		predict(options.predict, report_writer.get(), rom_accessor, trace, annotations);

		if (!options.asm_out_file.empty()) {
			Profile profile("Writing asm");
			ReportWriter asm_output(options.asm_out_file.c_str());
			asm_writer(asm_output, options, trace, annotations, rom_accessor);
		}

		if (report_writer) {
			data_report(*report_writer, trace, annotations);
			dma_report(*report_writer, trace, annotations);
			branch_report(*report_writer, rom_accessor, trace, annotations);
			entry_point_report(*report_writer, trace, annotations);
		}

	} catch (const std::runtime_error &e) {
		printf("error: %s\n", e.what());
		return 1;
	} catch (const std::exception &e) {
		printf("error: %s\n", e.what());
		return 1;
	}

	return 0;
}